

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O0

void gpc_g16(Pixel *out,Pixel *in,Background *back)

{
  png_uint_16 pVar1;
  double d;
  Background *back_local;
  Pixel *in_local;
  Pixel *out_local;
  
  d = YfromRGBint(in->r,in->g,in->b);
  pVar1 = u16d(d);
  out->b = (uint)pVar1;
  out->g = (uint)pVar1;
  out->r = (uint)pVar1;
  out->a = 0xffff;
  return;
}

Assistant:

static void
gpc_g16(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;
   out->r = out->g = out->b = u16d(YfromRGBint(in->r, in->g, in->b));
   out->a = 65535;
}